

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

void __thiscall
despot::util::tinyxml::TiXmlDeclaration::TiXmlDeclaration
          (TiXmlDeclaration *this,TiXmlDeclaration *copy)

{
  (this->super_TiXmlNode).super_TiXmlBase.location.row = -1;
  (this->super_TiXmlNode).super_TiXmlBase.location.col = -1;
  (this->super_TiXmlNode).super_TiXmlBase.userData = (void *)0x0;
  (this->super_TiXmlNode).parent = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).value.rep_ = (Rep *)&TiXmlString::nullrep_;
  (this->super_TiXmlNode).type = DECLARATION;
  (this->super_TiXmlNode).firstChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).lastChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).prev = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).next = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase =
       (_func_int **)&PTR__TiXmlDeclaration_001915f0;
  (this->version).rep_ = (Rep *)&TiXmlString::nullrep_;
  (this->encoding).rep_ = (Rep *)&TiXmlString::nullrep_;
  (this->standalone).rep_ = (Rep *)&TiXmlString::nullrep_;
  CopyTo(copy,this);
  return;
}

Assistant:

TiXmlDeclaration::TiXmlDeclaration(const TiXmlDeclaration& copy) :
	TiXmlNode(TiXmlNode::DECLARATION) {
	copy.CopyTo(this);
}